

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

TEdge * ClipperLib::FindNextLocMin(TEdge *E)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge *pTVar3;
  
  do {
    for (; ((pTVar1 = E->Prev, (E->Bot).X != (pTVar1->Bot).X || ((E->Bot).Y != (pTVar1->Bot).Y)) ||
           (((E->Curr).X == (E->Top).X && ((E->Curr).Y == (E->Top).Y)))); E = E->Next) {
    }
    if ((E->Dx != -1e+40) || (NAN(E->Dx))) {
      if (pTVar1->Dx != -1e+40) {
        return E;
      }
      if (NAN(pTVar1->Dx)) {
        return E;
      }
    }
    do {
      pTVar2 = E;
      pTVar1 = pTVar2->Prev;
      E = pTVar1;
    } while (pTVar1->Dx == -1e+40);
    E = pTVar2;
    pTVar3 = pTVar1;
    if ((pTVar2->Dx == -1e+40) && (!NAN(pTVar2->Dx))) {
      do {
        E = E->Next;
      } while (E->Dx == -1e+40);
      pTVar3 = E->Prev;
    }
    if ((E->Top).Y != (pTVar3->Bot).Y) {
      if ((pTVar1->Bot).X < (E->Bot).X) {
        E = pTVar2;
      }
      return E;
    }
  } while( true );
}

Assistant:

TEdge* FindNextLocMin(TEdge* E)
{
  for (;;)
  {
    while (E->Bot != E->Prev->Bot || E->Curr == E->Top) E = E->Next;
    if (!IsHorizontal(*E) && !IsHorizontal(*E->Prev)) break;
    while (IsHorizontal(*E->Prev)) E = E->Prev;
    TEdge* E2 = E;
    while (IsHorizontal(*E)) E = E->Next;
    if (E->Top.Y == E->Prev->Bot.Y) continue; //ie just an intermediate horz.
    if (E2->Prev->Bot.X < E->Bot.X) E = E2;
    break;
  }
  return E;
}